

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O1

void __thiscall amrex::EB2::Level::fillLevelSet(Level *this,MultiFab *levelset,Geometry *geom)

{
  int *piVar1;
  int iVar2;
  element_type *peVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer ppVar6;
  int i;
  uint uVar7;
  Periodicity *period;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  pointer pIVar12;
  int iVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  int iVar16;
  undefined1 auVar17 [16];
  Periodicity PVar18;
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box bx;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_120;
  pointer local_108;
  FabArray<amrex::FArrayBox> *local_100;
  pointer local_f8;
  pointer local_f0;
  pointer local_e8;
  long local_e0;
  long local_d8;
  MFIter mfi;
  Array4<double> local_70;
  
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&levelset->super_FabArray<amrex::FArrayBox>,-1.0,0,
             (levelset->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
             &(levelset->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
  period = Periodicity::NonPeriodic();
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  mfi.fabArray._0_4_ = 0;
  local_70.p = (double *)0x0;
  local_70.jstride._0_4_ = 0;
  FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (&levelset->super_FabArray<amrex::FArrayBox>,
             &(this->m_levelset).super_FabArray<amrex::FArrayBox>,0,0,1,(IntVect *)&mfi,
             (IntVect *)&local_70,period,COPY,(CPC *)0x0,false);
  PVar18 = Geometry::periodicity(geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = PVar18.period.vect._0_8_;
  mfi.fabArray._0_4_ = PVar18.period.vect[2];
  Periodicity::shiftIntVect(&local_120,(Periodicity *)&mfi);
  peVar3 = (this->m_covered_grids).m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      *(pointer *)
       ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data + 8)) {
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MFIter::MFIter(&mfi,(FabArrayBase *)levelset,'\0');
    if (mfi.currentIndex < mfi.endIndex) {
      local_100 = &levelset->super_FabArray<amrex::FArrayBox>;
      do {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_70,&levelset->super_FabArray<amrex::FArrayBox>,&mfi);
        FabArrayBase::fabbox
                  (&r,(FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,(int)mfi.fabArray),
                   ((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[mfi.currentIndex]);
        bx.bigend.vect[1] = r.bigend.vect[1];
        bx.bigend.vect[2] = r.bigend.vect[2];
        bx.btype.itype = r.btype.itype;
        bx.smallend.vect[0] = r.smallend.vect[0];
        bx.smallend.vect[1] = r.smallend.vect[1];
        bx.smallend.vect[2] = r.smallend.vect[2];
        bx.bigend.vect[0] = r.bigend.vect[0];
        lVar8 = 0;
        do {
          if ((bx.btype.itype >> ((uint)lVar8 & 0x1f) & 1) != 0) {
            piVar1 = bx.bigend.vect + lVar8;
            *piVar1 = *piVar1 + -1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        bx._20_8_ = bx._20_8_ & 0xffffffff;
        local_108 = local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        pIVar12 = local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            r.btype = bx.btype;
            r.smallend.vect[0] = bx.smallend.vect[0] + (int)*(undefined8 *)pIVar12->vect;
            r.smallend.vect[1] =
                 bx.smallend.vect[1] + (int)((ulong)*(undefined8 *)pIVar12->vect >> 0x20);
            r.smallend.vect[2] = bx.smallend.vect[2] + pIVar12->vect[2];
            r.bigend.vect[0] = bx.bigend.vect[0] + pIVar12->vect[0];
            r.bigend.vect[1] = bx.bigend.vect[1] + pIVar12->vect[1];
            r.bigend.vect[2] = bx.bigend.vect[2] + pIVar12->vect[2];
            BoxArray::intersections(&this->m_covered_grids,&r,&isects);
            auVar5 = _DAT_0077bb40;
            auVar4 = _DAT_0077bb30;
            local_f0 = isects.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (isects.
                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                isects.
                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              iVar2 = pIVar12->vect[0];
              ppVar6 = isects.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              do {
                local_e8 = ppVar6;
                iVar13 = (local_e8->second).smallend.vect[0];
                uVar7 = (local_e8->second).btype.itype;
                r.smallend.vect[0] = iVar13 - iVar2;
                iVar16 = (int)*(undefined8 *)(pIVar12->vect + 1);
                r.smallend.vect[1] = (local_e8->second).smallend.vect[1] - iVar16;
                r.smallend.vect[2] =
                     (local_e8->second).smallend.vect[2] -
                     (int)((ulong)*(undefined8 *)(pIVar12->vect + 1) >> 0x20);
                r.bigend.vect[0] = (local_e8->second).bigend.vect[0] - iVar2;
                r.bigend.vect[1] = (local_e8->second).bigend.vect[1] - iVar16;
                r.bigend.vect[2] = (local_e8->second).bigend.vect[2] - pIVar12->vect[2];
                lVar8 = 0;
                do {
                  if ((uVar7 >> ((uint)lVar8 & 0x1f) & 1) == 0) {
                    piVar1 = r.bigend.vect + lVar8;
                    *piVar1 = *piVar1 + 1;
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                r.btype.itype = 7;
                if (r.smallend.vect[2] <= r.bigend.vect[2]) {
                  local_e0 = (long)r.smallend.vect[1];
                  uVar7 = (iVar2 + r.bigend.vect[0]) - iVar13;
                  auVar15._4_4_ = 0;
                  auVar15._0_4_ = uVar7;
                  auVar15._8_4_ = uVar7;
                  auVar15._12_4_ = 0;
                  local_d8 = (long)r.smallend.vect[0] * 8;
                  auVar15 = auVar15 ^ auVar5;
                  iVar13 = r.smallend.vect[2];
                  do {
                    if (r.smallend.vect[1] <= r.bigend.vect[1]) {
                      lVar10 = CONCAT44(local_70.jstride._4_4_,(undefined4)local_70.jstride) * 8;
                      lVar11 = (long)local_70.p +
                               (local_e0 - local_70.begin.y) * lVar10 +
                               ((long)iVar13 - (long)local_70.begin.z) * local_70.kstride * 8 +
                               (long)local_70.begin.x * -8 + local_d8 + 8;
                      lVar8 = local_e0;
                      do {
                        if (r.smallend.vect[0] <= r.bigend.vect[0]) {
                          uVar9 = 0;
                          do {
                            auVar17._8_4_ = (int)uVar9;
                            auVar17._0_8_ = uVar9;
                            auVar17._12_4_ = (int)(uVar9 >> 0x20);
                            auVar17 = (auVar17 | auVar4) ^ auVar5;
                            if ((bool)(~(auVar15._4_4_ < auVar17._4_4_ ||
                                        auVar15._0_4_ < auVar17._0_4_ &&
                                        auVar17._4_4_ == auVar15._4_4_) & 1)) {
                              *(undefined8 *)(lVar11 + -8 + uVar9 * 8) = 0x3ff0000000000000;
                            }
                            if (auVar17._12_4_ <= auVar15._12_4_ &&
                                (auVar17._8_4_ <= auVar15._8_4_ || auVar17._12_4_ != auVar15._12_4_)
                               ) {
                              *(undefined8 *)(lVar11 + uVar9 * 8) = 0x3ff0000000000000;
                            }
                            uVar9 = uVar9 + 2;
                          } while (((ulong)uVar7 + 2 & 0xfffffffffffffffe) != uVar9);
                        }
                        lVar8 = lVar8 + 1;
                        lVar11 = lVar11 + lVar10;
                      } while (r.bigend.vect[1] + 1 != (int)lVar8);
                    }
                    bVar14 = iVar13 != r.bigend.vect[2];
                    iVar13 = iVar13 + 1;
                  } while (bVar14);
                }
                ppVar6 = local_e8 + 1;
                levelset = (MultiFab *)local_100;
                local_f8 = pIVar12;
              } while (local_e8 + 1 !=
                       isects.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            pIVar12 = pIVar12 + 1;
          } while (pIVar12 != local_108);
        }
        MFIter::operator++(&mfi);
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
    if (isects.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(isects.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
Level::fillLevelSet (MultiFab& levelset, const Geometry& geom) const
{
    levelset.setVal(-1.0);
    levelset.ParallelCopy(m_levelset,0,0,1,0,0);

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

    Real cov_val = 1.0; // for covered cells

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    if (!m_covered_grids.empty())
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(levelset); mfi.isValid(); ++mfi)
        {
            const auto& lsfab = levelset.array(mfi);
            const Box& ccbx = amrex::enclosedCells(mfi.fabbox());
            for (const auto& iv : pshifts)
            {
                m_covered_grids.intersections(ccbx+iv, isects);
                for (const auto& is : isects) {
                    const Box& fbx = amrex::surroundingNodes(is.second-iv);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(fbx, i, j, k,
                    {
                        lsfab(i,j,k) = cov_val;
                    });
                }
            }
        }
    }
}